

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombinatorNormalisationISE.cpp
# Opt level: O2

TermList __thiscall
Inferences::CombinatorNormalisationISE::createSCorBTerm
          (CombinatorNormalisationISE *this,TermList arg1,TermList arg1sort,TermList arg2,
          TermList arg2sort,Combinator comb)

{
  uint function;
  TermList TVar1;
  TermList TVar2;
  uint argNum;
  bool bVar3;
  TermList args [3];
  
  function = Kernel::Signature::getCombinator(DAT_00a14190,comb);
  bVar3 = (comb & ~C_COMB) == S_COMB;
  if (bVar3) {
    arg2sort._content = arg1sort._content;
  }
  argNum = bVar3 + 1;
  TVar1 = ApplicativeHelper::getNthArg(arg2sort,1);
  TVar2 = ApplicativeHelper::getNthArg(arg1sort,argNum);
  args[2] = ApplicativeHelper::getResultApplieadToNArgs(arg1sort,argNum);
  args[0] = TVar1;
  args[1] = TVar2;
  TVar1._content = (uint64_t)Kernel::Term::create(function,3,args);
  TVar2 = Kernel::SortHelper::getResultSort((Term *)TVar1._content);
  TVar1 = ApplicativeHelper::createAppTerm3(TVar2,TVar1,arg1,arg2);
  return (TermList)TVar1._content;
}

Assistant:

TermList CombinatorNormalisationISE::createSCorBTerm(TermList arg1, TermList arg1sort,
          TermList arg2, TermList arg2sort, Signature::Combinator comb)
{
  TermList s1, s2, s3;
  unsigned cb = env.signature->getCombinator(comb);
  
  if(comb == Signature::S_COMB || comb == Signature::C_COMB){
    //cout << "CCOMB arg1 " + arg1.toString() + " of sort " + arg1sort.toString() << endl; 
    s1 = AH::getNthArg(arg1sort, 1);
    s2 = AH::getNthArg(arg1sort, 2);
    s3 = AH::getResultApplieadToNArgs(arg1sort, 2);
  } else {
    //cout << "BCOMB arg1 " + arg1.toString() + " of sort " + arg1sort.toString() << endl; 
    s1 = AH::getNthArg(arg2sort, 1);
    s2 = AH::getNthArg(arg1sort, 1);
    s3 = AH::getResultApplieadToNArgs(arg1sort, 1);
  }
  
  TermList args[] = {s1, s2, s3};
  TermList c = TermList(Term::create(cb, 3, args));
  return AH::createAppTerm3(SortHelper::getResultSort(c.term()), c, arg1, arg2); 
}